

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  bool bVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  uint *puVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  uint *puVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  uint uVar21;
  byte bVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int *local_3b8;
  cpp_dec_float<200U,_int,_void> local_3a0;
  cpp_dec_float<200U,_int,_void> local_320;
  cpp_dec_float<200U,_int,_void> local_2a0;
  uint local_220 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar22 = 0;
  puVar16 = (uint *)eps;
  puVar18 = local_b0;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar18 = *puVar16;
    puVar16 = puVar16 + 1;
    puVar18 = puVar18 + 1;
  }
  local_40 = (eps->m_backend).exp;
  local_3c = (eps->m_backend).neg;
  local_38._0_4_ = (eps->m_backend).fpclass;
  local_38._4_4_ = (eps->m_backend).prec_elem;
  vSolveLright(this,rhs,ridx,&rn,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_b0);
  if (forest == (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x0) {
    if (rn < 1) {
      uVar21 = 0;
    }
    else {
      piVar4 = (this->row).perm;
      lVar9 = 0;
      uVar12 = 0;
      do {
        uVar21 = (uint)uVar12;
        iVar7 = ridx[lVar9];
        iVar6 = rhs[iVar7].m_backend.exp;
        bVar1 = rhs[iVar7].m_backend.neg;
        pcVar17 = &rhs[iVar7].m_backend;
        pcVar14 = &local_3a0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar14->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_3a0.fpclass = rhs[iVar7].m_backend.fpclass;
        local_3a0.prec_elem = rhs[iVar7].m_backend.prec_elem;
        pnVar15 = eps;
        pcVar17 = &local_320;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar17->data)._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_320.exp = (eps->m_backend).exp;
        local_320.neg = (eps->m_backend).neg;
        local_320.fpclass = (eps->m_backend).fpclass;
        local_320.prec_elem = (eps->m_backend).prec_elem;
        local_3a0.neg = bVar1;
        if ((bVar1 == true) &&
           (local_3a0.data._M_elems[0] != 0 || local_3a0.fpclass != cpp_dec_float_finite)) {
          local_3a0.neg = false;
        }
        local_3a0.exp = iVar6;
        if ((local_320.fpclass == cpp_dec_float_NaN || local_3a0.fpclass == cpp_dec_float_NaN) ||
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_3a0,&local_320), iVar6 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    (&rhs[iVar7].m_backend,0);
        }
        else {
          iVar7 = piVar4[iVar7];
          uVar11 = uVar21;
          if (0 < (int)uVar21) {
            do {
              uVar13 = (uint)uVar12 - 1;
              uVar8 = uVar13 >> 1;
              uVar11 = (uint)uVar12;
              if (iVar7 <= ridx[uVar8]) break;
              ridx[uVar12] = ridx[uVar8];
              uVar12 = (ulong)uVar8;
              uVar11 = uVar8;
            } while (1 < uVar13);
          }
          uVar12 = (ulong)(uVar21 + 1);
          ridx[(int)uVar11] = iVar7;
        }
        uVar21 = (uint)uVar12;
        lVar9 = lVar9 + 1;
      } while (lVar9 < rn);
    }
  }
  else {
    if (rn < 1) {
      uVar21 = 0;
    }
    else {
      local_3b8 = forestIdx;
      piVar4 = (this->row).perm;
      lVar9 = 0;
      uVar21 = 0;
      do {
        iVar7 = ridx[lVar9];
        pcVar17 = &rhs[iVar7].m_backend;
        pcVar14 = pcVar17;
        puVar16 = local_220;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          *puVar16 = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
          puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
        }
        iVar6 = rhs[iVar7].m_backend.exp;
        bVar1 = rhs[iVar7].m_backend.neg;
        fVar2 = rhs[iVar7].m_backend.fpclass;
        iVar3 = rhs[iVar7].m_backend.prec_elem;
        pcVar14 = pcVar17;
        pcVar19 = &local_3a0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar19->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        pnVar15 = eps;
        pcVar14 = &local_2a0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar14->data)._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_2a0.exp = (eps->m_backend).exp;
        local_2a0.neg = (eps->m_backend).neg;
        local_2a0.fpclass = (eps->m_backend).fpclass;
        local_2a0.prec_elem = (eps->m_backend).prec_elem;
        local_3a0.prec_elem = iVar3;
        local_3a0.fpclass = fVar2;
        local_3a0.neg = bVar1;
        if ((bVar1 == true) && (local_3a0.data._M_elems[0] != 0 || fVar2 != cpp_dec_float_finite)) {
          local_3a0.neg = false;
        }
        local_3a0.exp = iVar6;
        if ((local_2a0.fpclass == cpp_dec_float_NaN || fVar2 == cpp_dec_float_NaN) ||
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_3a0,&local_2a0), iVar5 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar17,0);
        }
        else {
          *local_3b8 = iVar7;
          iVar5 = piVar4[iVar7];
          uVar11 = uVar21;
          if (0 < (int)uVar21) {
            do {
              uVar8 = uVar11 - 1;
              uVar13 = uVar8 >> 1;
              if (iVar5 <= ridx[uVar13]) break;
              ridx[uVar11] = ridx[uVar13];
              uVar11 = uVar13;
            } while (1 < uVar8);
          }
          local_3b8 = local_3b8 + 1;
          uVar21 = uVar21 + 1;
          ridx[(int)uVar11] = iVar5;
          puVar16 = local_220;
          pnVar15 = forest + iVar7;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar15->m_backend).data._M_elems[0] = *puVar16;
            puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
            pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
          }
          forest[iVar7].m_backend.exp = iVar6;
          forest[iVar7].m_backend.neg = bVar1;
          forest[iVar7].m_backend.fpclass = fVar2;
          forest[iVar7].m_backend.prec_elem = iVar3;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < rn);
    }
    *forestNum = uVar21;
  }
  pnVar15 = eps;
  pnVar20 = &local_130;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar20->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
    pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
    pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_130.m_backend.exp = (eps->m_backend).exp;
  local_130.m_backend.neg = (eps->m_backend).neg;
  local_130.m_backend.fpclass = (eps->m_backend).fpclass;
  local_130.m_backend.prec_elem = (eps->m_backend).prec_elem;
  rn = uVar21;
  iVar7 = vSolveUright(this,vec,idx,rhs,ridx,uVar21,&local_130);
  if ((this->l).updateType == 0) {
    pnVar15 = eps;
    pnVar20 = &local_1b0;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar20->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (eps->m_backend).exp;
    local_1b0.m_backend.neg = (eps->m_backend).neg;
    local_1b0.m_backend.fpclass = (eps->m_backend).fpclass;
    local_1b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
    rn = iVar7;
    iVar7 = vSolveUpdateRight(this,vec,idx,iVar7,&local_1b0);
  }
  return iVar7;
}

Assistant:

int CLUFactor<R>::vSolveRight4update(R eps,
                                     R* vec, int* idx,                       /* result */
                                     R* rhs, int* ridx, int rn,              /* rhs    */
                                     R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright(rhs, ridx, rn, eps);
   assert(rn >= 0 && rn <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn, eps);

   return rn;
}